

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

void __thiscall QCborStreamReaderPrivate::initDecoder(QCborStreamReaderPrivate *this)

{
  QByteArray *this_00;
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  Code CVar4;
  qsizetype alloc;
  
  QList<CborValue>::clear(&(this->containerStack).super_QList<CborValue>);
  this->bufferStart = 0;
  if (this->device != (QIODevice *)0x0) {
    this_00 = &this->buffer;
    QByteArray::clear(this_00);
    pDVar2 = (this->buffer).d.d;
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) - (long)(this->buffer).d.ptr) < 0x100)) {
      lVar3 = (this->buffer).d.size;
      alloc = 0x100;
      if (0x100 < lVar3) {
        alloc = lVar3;
      }
      QByteArray::reallocData(this_00,alloc,KeepSize);
    }
    pDVar2 = (this_00->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  preread(this);
  (this->parser).source.end = (uint8_t *)0x0;
  *(undefined8 *)&(this->parser).flags = 0;
  (this->parser).source.end = (uint8_t *)0x0;
  (this->parser).flags = CborParserFlag_ExternalSource;
  (this->currentElement).parser = &this->parser;
  (this->currentElement).source.ptr = (uint8_t *)this;
  (this->currentElement).remaining = 1;
  CVar4 = preparse_value(&this->currentElement);
  if ((CVar4 != NoError) && (CVar4 != EndOfFile)) {
    this->corrupt = true;
  }
  (this->lastError).c = CVar4;
  return;
}

Assistant:

void initDecoder()
    {
        containerStack.clear();
        bufferStart = 0;
        if (device) {
            buffer.clear();
            buffer.reserve(IdealIoBufferSize);      // sets the CapacityReserved flag
        }

        preread();
        if (CborError err = cbor_parser_init_reader(nullptr, &parser, &currentElement, this))
            handleError(err);
        else
            lastError = { QCborError::NoError };
    }